

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

char * __thiscall mp::internal::BinaryReaderBase::Read(BinaryReaderBase *this,int length)

{
  char *pcVar1;
  int in_ESI;
  long *in_RDI;
  char *start;
  CStringRef in_stack_00000010;
  BasicCStringRef<char> local_18;
  int local_c;
  
  local_c = in_ESI;
  if (in_RDI[2] - *in_RDI < (long)in_ESI) {
    in_RDI[3] = in_RDI[2];
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"unexpected end of file");
    ReportError<>((BinaryReaderBase *)start,in_stack_00000010);
  }
  pcVar1 = (char *)*in_RDI;
  *in_RDI = *in_RDI + (long)local_c;
  return pcVar1;
}

Assistant:

const char *Read(int length) {
    if (end_ - ptr_ < length) {
      token_ = end_;
      ReportError("unexpected end of file");
    }
    const char *start = ptr_;
    ptr_ += length;
    return start;
  }